

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O2

void duckdb_table_description_destroy(duckdb_table_description *table)

{
  TableDescriptionWrapper *this;
  
  if ((table != (duckdb_table_description *)0x0) &&
     (this = (TableDescriptionWrapper *)*table, this != (TableDescriptionWrapper *)0x0)) {
    duckdb::TableDescriptionWrapper::~TableDescriptionWrapper(this);
    operator_delete(this);
    *table = (duckdb_table_description)0x0;
  }
  return;
}

Assistant:

void duckdb_table_description_destroy(duckdb_table_description *table) {
	if (!table || !*table) {
		return;
	}
	auto wrapper = reinterpret_cast<TableDescriptionWrapper *>(*table);
	delete wrapper;
	*table = nullptr;
}